

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.h
# Opt level: O0

void __thiscall
flow::PassManager::logDebug<std::__cxx11::string>
          (PassManager *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string_view format_str;
  basic_string_view<char> local_50;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *msg_local;
  PassManager *this_local;
  
  local_20 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg;
  msg_local = (char *)this;
  fmt::v5::basic_string_view<char>::basic_string_view(&local_50,msg);
  format_str.size_ = (size_t)args;
  format_str.data_ = (char *)local_50.size_;
  fmt::v5::format<std::__cxx11::string>(&local_40,(v5 *)local_50.data_,format_str,in_R8);
  logDebug(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void logDebug(const char* msg, Args... args) {
    logDebug(fmt::format(msg, args...));
  }